

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O0

string * __thiscall
IDenseNetwork::GetStringStats_abi_cxx11_(string *__return_storage_ptr__,IDenseNetwork *this)

{
  bool bVar1;
  reference ppIVar2;
  ostream *poVar3;
  ILayer *layer;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ILayer_*,_std::allocator<ILayer_*>_> *__range1;
  stringstream ss;
  ostream local_190 [376];
  IDenseNetwork *local_18;
  IDenseNetwork *this_local;
  
  local_18 = this;
  this_local = (IDenseNetwork *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  __end1 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::begin(&this->layers);
  layer = (ILayer *)std::vector<ILayer_*,_std::allocator<ILayer_*>_>::end(&this->layers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ILayer_*const_*,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>
                                *)&layer);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<ILayer_*const_*,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>
              ::operator*(&__end1);
    poVar3 = operator<<(local_190,*ppIVar2);
    std::operator<<(poVar3,"\n");
    __gnu_cxx::__normal_iterator<ILayer_*const_*,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string IDenseNetwork::GetStringStats() const
{
    std::stringstream ss;
    for ( ILayer *layer: layers ) {
        ss << *layer << "\n";
    }
    return ss.str();
}